

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLog>::operator()
          (StairsRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterYs<unsigned_char> *pGVar7;
  TransformerLinLog *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  ImPlotContext *pIVar15;
  int iVar16;
  ImDrawIdx IVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  pIVar15 = GImPlot;
  pGVar7 = this->Getter;
  pTVar8 = this->Transformer;
  iVar16 = pGVar7->Count;
  dVar1 = pGVar7->XScale;
  dVar2 = pGVar7->X0;
  dVar12 = log10((double)pGVar7->Ys
                         [(long)(((prim + 1 + pGVar7->Offset) % iVar16 + iVar16) % iVar16) *
                          (long)pGVar7->Stride] /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar16 = pTVar8->YAxis;
  pIVar9 = pIVar15->CurrentPlot;
  dVar3 = pIVar9->YAxis[iVar16].Range.Min;
  IVar4 = pIVar15->PixelRange[iVar16].Min;
  fVar18 = (float)(pIVar15->Mx * ((dVar2 + (double)(prim + 1) * dVar1) - (pIVar9->XAxis).Range.Min)
                  + (double)IVar4.x);
  fVar19 = (float)(pIVar15->My[iVar16] *
                   ((dVar3 + (double)(float)(dVar12 / pIVar15->LogDenY[iVar16]) *
                             (pIVar9->YAxis[iVar16].Range.Max - dVar3)) - dVar3) + (double)IVar4.y);
  fVar20 = (this->P1).x;
  fVar21 = (this->P1).y;
  auVar23._0_4_ = ~-(uint)(fVar18 <= fVar20) & (uint)fVar18;
  auVar23._4_4_ = ~-(uint)(fVar19 <= fVar21) & (uint)fVar19;
  auVar23._8_4_ = ~-(uint)(fVar20 < fVar18) & (uint)fVar18;
  auVar23._12_4_ = ~-(uint)(fVar21 < fVar19) & (uint)fVar19;
  auVar13._4_4_ = (uint)fVar21 & -(uint)(fVar19 <= fVar21);
  auVar13._0_4_ = (uint)fVar20 & -(uint)(fVar18 <= fVar20);
  auVar13._8_4_ = (uint)fVar20 & -(uint)(fVar20 < fVar18);
  auVar13._12_4_ = (uint)fVar21 & -(uint)(fVar21 < fVar19);
  auVar23 = auVar23 | auVar13;
  fVar22 = (cull_rect->Min).y;
  auVar14._4_8_ = auVar23._8_8_;
  auVar14._0_4_ = -(uint)(auVar23._4_4_ < fVar22);
  auVar24._0_8_ = auVar14._0_8_ << 0x20;
  auVar24._8_4_ = -(uint)(auVar23._8_4_ < (cull_rect->Max).x);
  auVar24._12_4_ = -(uint)(auVar23._12_4_ < (cull_rect->Max).y);
  auVar25._4_4_ = -(uint)(fVar22 < auVar23._4_4_);
  auVar25._0_4_ = -(uint)((cull_rect->Min).x < auVar23._0_4_);
  auVar25._8_8_ = auVar24._8_8_;
  iVar16 = movmskps((int)pIVar9,auVar25);
  if (iVar16 == 0xf) {
    fVar22 = fVar21 + this->HalfWeight;
    fVar21 = fVar21 - this->HalfWeight;
    IVar5 = this->Col;
    IVar4 = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = fVar20;
    (pIVar10->pos).y = fVar22;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar18;
    pIVar10[1].pos.y = fVar21;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar20;
    pIVar10[2].pos.y = fVar21;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = fVar18;
    pIVar10[3].pos.y = fVar22;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar6;
    *pIVar11 = IVar17;
    pIVar11[1] = IVar17 + 1;
    pIVar11[2] = IVar17 + 2;
    pIVar11[3] = IVar17;
    pIVar11[4] = IVar17 + 1;
    pIVar11[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
    fVar21 = fVar18 - this->HalfWeight;
    fVar20 = this->HalfWeight + fVar18;
    fVar22 = (this->P1).y;
    IVar5 = this->Col;
    IVar4 = *uv;
    pIVar10[4].pos.x = fVar21;
    pIVar10[4].pos.y = fVar19;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar20;
    pIVar10[1].pos.y = fVar22;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar21;
    pIVar10[2].pos.y = fVar22;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = fVar20;
    pIVar10[3].pos.y = fVar19;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar6;
    *pIVar11 = IVar17;
    pIVar11[1] = IVar17 + 1;
    pIVar11[2] = IVar17 + 2;
    pIVar11[3] = IVar17;
    pIVar11[4] = IVar17 + 1;
    pIVar11[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
  }
  IVar4.y = fVar19;
  IVar4.x = fVar18;
  this->P1 = IVar4;
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }